

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

ssize_t perfetto::base::Base64Decode(char *src,size_t src_size,uint8_t *dst,size_t dst_size)

{
  uint __errnum;
  code *pcVar1;
  ssize_t sVar2;
  ulong uVar3;
  uint *puVar4;
  char *pcVar5;
  size_t src_size_00;
  ulong unaff_RBX;
  undefined7 uVar6;
  char cVar7;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  uint8_t d [4];
  char s [4];
  uint8_t *puStack_70;
  size_t sStack_68;
  uint8_t uStack_60;
  undefined7 uStack_5f;
  ulong uStack_50;
  char local_20 [4];
  char local_1c [4];
  
  sVar2 = -1;
  if ((src_size + 3 >> 2) * 3 <= dst_size) {
    pcVar8 = src + src_size;
    local_1c[0] = '\0';
    local_1c[1] = '\0';
    local_1c[2] = '\0';
    local_1c[3] = '\0';
    uVar3 = 0;
    while (src < pcVar8) {
      bVar10 = false;
      uVar9 = 0;
      do {
        if (src < pcVar8) {
          unaff_RBX = CONCAT71((int7)(unaff_RBX >> 8),*src);
          src = src + 1;
        }
        else {
          unaff_RBX = 0x3d;
          if (uVar9 < 2) {
            unaff_RBX = 0;
          }
        }
        local_1c[uVar9] = (char)unaff_RBX;
        cVar7 = -1;
        if (0xaf < (byte)((char)unaff_RBX + 0x85U)) {
          unaff_RBX = unaff_RBX & 0xff;
          cVar7 = "N8perfetto8internal20SystemTracingBackendE"[unaff_RBX + 0xd];
        }
        local_20[uVar9] = cVar7;
        if (cVar7 == -1) break;
        bVar10 = 2 < uVar9;
        unaff_RBX = uVar9 + 1;
        uVar9 = unaff_RBX;
      } while (unaff_RBX != 4);
      if (!bVar10) {
        return -1;
      }
      uVar6 = (undefined7)(unaff_RBX >> 8);
      dst[uVar3] = (byte)((CONCAT71(uVar6,local_20[1]) & 0xffffffff) >> 4) & 0xf | local_20[0] << 2;
      unaff_RBX = CONCAT71(uVar6,local_20[1] << 4);
      dst[uVar3 + 1] = (byte)local_20[2] >> 2 | local_20[1] << 4;
      dst[uVar3 + 2] = local_20[2] << 6 | local_20[3];
      uVar3 = uVar3 + 3;
    }
    if (dst_size < uVar3) {
      Base64Decode();
      sStack_68 = 0;
      uStack_60 = '\0';
      puStack_70 = &uStack_60;
      uStack_50 = unaff_RBX;
      ::std::__cxx11::string::resize((ulong)&puStack_70,(char)(src_size_00 + 3 >> 2) * '\x03');
      sVar2 = Base64Decode(pcVar8,src_size_00,puStack_70,sStack_68);
      if (sVar2 < 0) {
        *src = '\0';
        src[8] = '\0';
      }
      else {
        if ((long)sStack_68 < sVar2) {
          pcVar8 = Basename(
                           "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                           );
          puVar4 = (uint *)__errno_location();
          __errnum = *puVar4;
          pcVar5 = strerror(__errnum);
          LogMessage(kLogError,pcVar8,0x7a9,"%s (errno: %d, %s)",
                     "PERFETTO_CHECK(res <= static_cast<ssize_t>(dst.size()))",(ulong)__errnum,
                     pcVar5);
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        ::std::__cxx11::string::resize((ulong)&puStack_70,(char)sVar2);
        *src = '\x01';
        *(char **)(src + 8) = src + 0x18;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)(src + 8),puStack_70,puStack_70 + sStack_68);
      }
      if (puStack_70 != &uStack_60) {
        operator_delete(puStack_70,CONCAT71(uStack_5f,uStack_60) + 1);
      }
      return (ssize_t)src;
    }
    sVar2 = (uVar3 - (local_1c[3] == '=')) - (ulong)(local_1c[2] == '=');
  }
  return sVar2;
}

Assistant:

inline size_t Base64DecSize(size_t src_size) {
  return (src_size + 3) / 4 * 3;
}